

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isBooleanConvertible(Type *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  Type *in_RDI;
  bool local_1;
  
  pTVar2 = getCanonicalType(in_RDI);
  SVar1 = (pTVar2->super_Symbol).kind;
  if (((SVar1 - ClassType < 2) || (SVar1 - NullType < 4)) || (SVar1 == VirtualInterfaceType)) {
    local_1 = true;
  }
  else {
    local_1 = isNumeric(in_RDI);
  }
  return local_1;
}

Assistant:

bool Type::isBooleanConvertible() const {
    switch (getCanonicalType().kind) {
        case SymbolKind::NullType:
        case SymbolKind::CHandleType:
        case SymbolKind::StringType:
        case SymbolKind::EventType:
        case SymbolKind::ClassType:
        case SymbolKind::CovergroupType:
        case SymbolKind::VirtualInterfaceType:
            return true;
        default:
            return isNumeric();
    }
}